

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3BtreeIntegrityCheck
              (sqlite3 *db,Btree *p,Pgno *aRoot,Mem *aCnt,int nRoot,int mxErr,int *pnErr,
              char **pzOut)

{
  BtShared *pBt_00;
  u64 uVar1;
  u32 uVar2;
  u32 N;
  int iVar3;
  Pgno PVar4;
  char *pcVar5;
  i64 local_150;
  i64 notUsed;
  Pgno mxInHdr;
  Pgno mx;
  int bCkFreelist;
  int bPartial;
  char zErr [100];
  u64 savedDbFlags;
  BtShared *pBt;
  IntegrityCk sCheck;
  Pgno i;
  int mxErr_local;
  int nRoot_local;
  Mem *aCnt_local;
  Pgno *aRoot_local;
  Btree *p_local;
  sqlite3 *db_local;
  
  pBt_00 = p->pBt;
  uVar1 = pBt_00->db->flags;
  mxInHdr = 1;
  if (*aRoot == 0) {
    mxInHdr = (Pgno)(aRoot[1] == 1);
  }
  mx = (Pgno)(*aRoot == 0);
  sqlite3BtreeEnter(p);
  memset(&pBt,0,0x80);
  sCheck.pBt = (BtShared *)pBt_00->pPager;
  pBt = pBt_00;
  sCheck.heap = (u32 *)db;
  sCheck.aPgRef._0_4_ = btreePagecount(pBt_00);
  sCheck.aPgRef._4_4_ = mxErr;
  sqlite3StrAccumInit((StrAccum *)&sCheck.v2,(sqlite3 *)0x0,(char *)&bCkFreelist,100,1000000000);
  sCheck.errMsg.mxAlloc._1_1_ = 1;
  if ((Pgno)sCheck.aPgRef != 0) {
    sCheck.pPager = (Pager *)sqlite3MallocZero((ulong)(((Pgno)sCheck.aPgRef >> 3) + 1));
    if (sCheck.pPager == (Pager *)0x0) {
      checkOom((IntegrityCk *)&pBt);
    }
    else {
      sCheck.errMsg._24_8_ = sqlite3PageMalloc(pBt_00->pageSize);
      if ((void *)sCheck.errMsg._24_8_ == (void *)0x0) {
        checkOom((IntegrityCk *)&pBt);
      }
      else {
        sCheck.nRow._4_4_ = (uint)sqlite3PendingByte / pBt_00->pageSize + 1;
        if (sCheck.nRow._4_4_ <= (Pgno)sCheck.aPgRef) {
          setPageReferenced((IntegrityCk *)&pBt,sCheck.nRow._4_4_);
        }
        if (mxInHdr != 0) {
          sCheck._40_8_ = anon_var_dwarf_1383c;
          uVar2 = sqlite3Get4byte(pBt_00->pPage1->aData + 0x20);
          N = sqlite3Get4byte(pBt_00->pPage1->aData + 0x24);
          checkList((IntegrityCk *)&pBt,1,uVar2,N);
          sCheck.nStep = 0;
          sCheck._44_4_ = 0;
        }
        if (mx == 0) {
          if (pBt_00->autoVacuum == '\0') {
            uVar2 = sqlite3Get4byte(pBt_00->pPage1->aData + 0x40);
            if (uVar2 != 0) {
              checkAppendMsg((IntegrityCk *)&pBt,
                             "incremental_vacuum enabled with a max rootpage of zero");
            }
          }
          else {
            notUsed._4_4_ = 0;
            for (sCheck.nRow._4_4_ = 0; (int)sCheck.nRow._4_4_ < nRoot;
                sCheck.nRow._4_4_ = sCheck.nRow._4_4_ + 1) {
              if (notUsed._4_4_ < aRoot[sCheck.nRow._4_4_]) {
                notUsed._4_4_ = aRoot[sCheck.nRow._4_4_];
              }
            }
            notUsed._0_4_ = sqlite3Get4byte(pBt_00->pPage1->aData + 0x34);
            if (notUsed._4_4_ != (u32)notUsed) {
              checkAppendMsg((IntegrityCk *)&pBt,"max rootpage (%u) disagrees with header (%u)",
                             (ulong)notUsed._4_4_,(ulong)(u32)notUsed);
            }
          }
        }
        pBt_00->db->flags = pBt_00->db->flags & 0xffffffffffdfffff;
        for (sCheck.nRow._4_4_ = 0; (int)sCheck.nRow._4_4_ < nRoot && sCheck.aPgRef._4_4_ != 0;
            sCheck.nRow._4_4_ = sCheck.nRow._4_4_ + 1) {
          sCheck.db = (sqlite3 *)0x0;
          if (aRoot[sCheck.nRow._4_4_] != 0) {
            if (((pBt_00->autoVacuum != '\0') && (1 < aRoot[sCheck.nRow._4_4_])) && (mx == 0)) {
              checkPtrmap((IntegrityCk *)&pBt,aRoot[sCheck.nRow._4_4_],'\x01',0);
            }
            sCheck.zPfx._0_4_ = aRoot[sCheck.nRow._4_4_];
            checkTreePage((IntegrityCk *)&pBt,aRoot[sCheck.nRow._4_4_],&local_150,0x7fffffffffffffff
                         );
          }
          sqlite3MemSetArrayInt64(aCnt,sCheck.nRow._4_4_,(i64)sCheck.db);
        }
        pBt_00->db->flags = uVar1;
        if (mx == 0) {
          for (sCheck.nRow._4_4_ = 1;
              sCheck.nRow._4_4_ <= (Pgno)sCheck.aPgRef && sCheck.aPgRef._4_4_ != 0;
              sCheck.nRow._4_4_ = sCheck.nRow._4_4_ + 1) {
            iVar3 = getPageReferenced((IntegrityCk *)&pBt,sCheck.nRow._4_4_);
            if ((iVar3 == 0) &&
               ((PVar4 = ptrmapPageno(pBt_00,sCheck.nRow._4_4_), PVar4 != sCheck.nRow._4_4_ ||
                (pBt_00->autoVacuum == '\0')))) {
              checkAppendMsg((IntegrityCk *)&pBt,"Page %u: never used",(ulong)sCheck.nRow._4_4_);
            }
            iVar3 = getPageReferenced((IntegrityCk *)&pBt,sCheck.nRow._4_4_);
            if (((iVar3 != 0) &&
                (PVar4 = ptrmapPageno(pBt_00,sCheck.nRow._4_4_), PVar4 == sCheck.nRow._4_4_)) &&
               (pBt_00->autoVacuum != '\0')) {
              checkAppendMsg((IntegrityCk *)&pBt,"Page %u: pointer map referenced",
                             (ulong)sCheck.nRow._4_4_);
            }
          }
        }
      }
    }
  }
  sqlite3PageFree((void *)sCheck.errMsg._24_8_);
  sqlite3_free(sCheck.pPager);
  *pnErr = sCheck.nCkPage;
  if (sCheck.nCkPage == 0) {
    sqlite3_str_reset((StrAccum *)&sCheck.v2);
    *pzOut = (char *)0x0;
  }
  else {
    pcVar5 = sqlite3StrAccumFinish((StrAccum *)&sCheck.v2);
    *pzOut = pcVar5;
  }
  sqlite3BtreeLeave(p);
  return sCheck.mxErr;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeIntegrityCheck(
  sqlite3 *db,  /* Database connection that is running the check */
  Btree *p,     /* The btree to be checked */
  Pgno *aRoot,  /* An array of root pages numbers for individual trees */
  Mem *aCnt,    /* Memory cells to write counts for each tree to */
  int nRoot,    /* Number of entries in aRoot[] */
  int mxErr,    /* Stop reporting errors after this many */
  int *pnErr,   /* OUT: Write number of errors seen to this variable */
  char **pzOut  /* OUT: Write the error message string here */
){
  Pgno i;
  IntegrityCk sCheck;
  BtShared *pBt = p->pBt;
  u64 savedDbFlags = pBt->db->flags;
  char zErr[100];
  int bPartial = 0;            /* True if not checking all btrees */
  int bCkFreelist = 1;         /* True to scan the freelist */
  VVA_ONLY( int nRef );

  assert( nRoot>0 );
  assert( aCnt!=0 );

  /* aRoot[0]==0 means this is a partial check */
  if( aRoot[0]==0 ){
    assert( nRoot>1 );
    bPartial = 1;
    if( aRoot[1]!=1 ) bCkFreelist = 0;
  }

  sqlite3BtreeEnter(p);
  assert( p->inTrans>TRANS_NONE && pBt->inTransaction>TRANS_NONE );
  VVA_ONLY( nRef = sqlite3PagerRefcount(pBt->pPager) );
  assert( nRef>=0 );
  memset(&sCheck, 0, sizeof(sCheck));
  sCheck.db = db;
  sCheck.pBt = pBt;
  sCheck.pPager = pBt->pPager;
  sCheck.nCkPage = btreePagecount(sCheck.pBt);
  sCheck.mxErr = mxErr;
  sqlite3StrAccumInit(&sCheck.errMsg, 0, zErr, sizeof(zErr), SQLITE_MAX_LENGTH);
  sCheck.errMsg.printfFlags = SQLITE_PRINTF_INTERNAL;
  if( sCheck.nCkPage==0 ){
    goto integrity_ck_cleanup;
  }

  sCheck.aPgRef = sqlite3MallocZero((sCheck.nCkPage / 8)+ 1);
  if( !sCheck.aPgRef ){
    checkOom(&sCheck);
    goto integrity_ck_cleanup;
  }
  sCheck.heap = (u32*)sqlite3PageMalloc( pBt->pageSize );
  if( sCheck.heap==0 ){
    checkOom(&sCheck);
    goto integrity_ck_cleanup;
  }

  i = PENDING_BYTE_PAGE(pBt);
  if( i<=sCheck.nCkPage ) setPageReferenced(&sCheck, i);

  /* Check the integrity of the freelist
  */
  if( bCkFreelist ){
    sCheck.zPfx = "Freelist: ";
    checkList(&sCheck, 1, get4byte(&pBt->pPage1->aData[32]),
              get4byte(&pBt->pPage1->aData[36]));
    sCheck.zPfx = 0;
  }

  /* Check all the tables.
  */
#ifndef SQLITE_OMIT_AUTOVACUUM
  if( !bPartial ){
    if( pBt->autoVacuum ){
      Pgno mx = 0;
      Pgno mxInHdr;
      for(i=0; (int)i<nRoot; i++) if( mx<aRoot[i] ) mx = aRoot[i];
      mxInHdr = get4byte(&pBt->pPage1->aData[52]);
      if( mx!=mxInHdr ){
        checkAppendMsg(&sCheck,
          "max rootpage (%u) disagrees with header (%u)",
          mx, mxInHdr
        );
      }
    }else if( get4byte(&pBt->pPage1->aData[64])!=0 ){
      checkAppendMsg(&sCheck,
        "incremental_vacuum enabled with a max rootpage of zero"
      );
    }
  }
#endif
  testcase( pBt->db->flags & SQLITE_CellSizeCk );
  pBt->db->flags &= ~(u64)SQLITE_CellSizeCk;
  for(i=0; (int)i<nRoot && sCheck.mxErr; i++){
    sCheck.nRow = 0;
    if( aRoot[i] ){
      i64 notUsed;
#ifndef SQLITE_OMIT_AUTOVACUUM
      if( pBt->autoVacuum && aRoot[i]>1 && !bPartial ){
        checkPtrmap(&sCheck, aRoot[i], PTRMAP_ROOTPAGE, 0);
      }
#endif
      sCheck.v0 = aRoot[i];
      checkTreePage(&sCheck, aRoot[i], &notUsed, LARGEST_INT64);
    }
    sqlite3MemSetArrayInt64(aCnt, i, sCheck.nRow);
  }
  pBt->db->flags = savedDbFlags;

  /* Make sure every page in the file is referenced
  */
  if( !bPartial ){
    for(i=1; i<=sCheck.nCkPage && sCheck.mxErr; i++){
#ifdef SQLITE_OMIT_AUTOVACUUM
      if( getPageReferenced(&sCheck, i)==0 ){
        checkAppendMsg(&sCheck, "Page %u: never used", i);
      }
#else
      /* If the database supports auto-vacuum, make sure no tables contain
      ** references to pointer-map pages.
      */
      if( getPageReferenced(&sCheck, i)==0 &&
         (PTRMAP_PAGENO(pBt, i)!=i || !pBt->autoVacuum) ){
        checkAppendMsg(&sCheck, "Page %u: never used", i);
      }
      if( getPageReferenced(&sCheck, i)!=0 &&
         (PTRMAP_PAGENO(pBt, i)==i && pBt->autoVacuum) ){
        checkAppendMsg(&sCheck, "Page %u: pointer map referenced", i);
      }
#endif
    }
  }

  /* Clean  up and report errors.
  */
integrity_ck_cleanup:
  sqlite3PageFree(sCheck.heap);
  sqlite3_free(sCheck.aPgRef);
  *pnErr = sCheck.nErr;
  if( sCheck.nErr==0 ){
    sqlite3_str_reset(&sCheck.errMsg);
    *pzOut = 0;
  }else{
    *pzOut = sqlite3StrAccumFinish(&sCheck.errMsg);
  }
  /* Make sure this analysis did not leave any unref() pages. */
  assert( nRef==sqlite3PagerRefcount(pBt->pPager) );
  sqlite3BtreeLeave(p);
  return sCheck.rc;
}